

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svg.cpp
# Opt level: O3

Color __thiscall
CGL::TexTri::color(TexTri *this,Vector3D *p_bary,Vector3D *p_dx_bary,Vector3D *p_dy_bary,
                  SampleParams *sp)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  Color CVar7;
  
  dVar3 = p_bary->x;
  dVar4 = p_bary->y;
  dVar5 = (this->p0_uv).y;
  dVar6 = (this->p2_uv).y;
  dVar1 = (this->p1_uv).y;
  dVar2 = p_bary->z;
  (sp->p_uv).x = dVar2 * (this->p2_uv).x + (this->p0_uv).x * dVar3 + (this->p1_uv).x * dVar4;
  (sp->p_uv).y = dVar2 * dVar6 + dVar1 * dVar4 + dVar5 * dVar3;
  dVar3 = p_dx_bary->x;
  dVar4 = p_dx_bary->y;
  dVar5 = (this->p0_uv).y;
  dVar6 = (this->p2_uv).y;
  dVar1 = (this->p1_uv).y;
  dVar2 = p_dx_bary->z;
  (sp->p_dx_uv).x = dVar2 * (this->p2_uv).x + (this->p0_uv).x * dVar3 + (this->p1_uv).x * dVar4;
  (sp->p_dx_uv).y = dVar2 * dVar6 + dVar1 * dVar4 + dVar5 * dVar3;
  dVar3 = p_dy_bary->x;
  dVar4 = p_dy_bary->y;
  dVar5 = (this->p0_uv).y;
  dVar6 = (this->p2_uv).y;
  dVar1 = (this->p1_uv).y;
  dVar2 = p_dy_bary->z;
  (sp->p_dy_uv).x = dVar2 * (this->p2_uv).x + (this->p0_uv).x * dVar3 + (this->p1_uv).x * dVar4;
  (sp->p_dy_uv).y = dVar2 * dVar6 + dVar1 * dVar4 + dVar5 * dVar3;
  CVar7 = Texture::sample(this->tex,sp);
  return CVar7;
}

Assistant:

Color TexTri::color(Vector3D p_bary, Vector3D p_dx_bary, Vector3D p_dy_bary, SampleParams sp) {
  // Part 5: Fill this in with bilinear sampling.
    Vector2D uv = this->p0_uv * p_bary.x + this->p1_uv * p_bary.y + this->p2_uv * p_bary.z;
    sp.p_uv = uv;
    Vector2D dx_uv = this->p0_uv * p_dx_bary.x + this->p1_uv * p_dx_bary.y + this->p2_uv * p_dx_bary.z;
    sp.p_dx_uv = dx_uv;
    Vector2D dy_uv = this->p0_uv * p_dy_bary.x + this->p1_uv * p_dy_bary.y + this->p2_uv * p_dy_bary.z;
    sp.p_dy_uv = dy_uv;
    
    return this->tex->sample(sp);
  // Part 6: Fill this in with trilinear sampling as well.
}